

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O1

void __thiscall
boost::shared_ptr<boost::iostreams::detail::file_descriptor_impl>::
reset<boost::iostreams::detail::file_descriptor_impl>
          (shared_ptr<boost::iostreams::detail::file_descriptor_impl> *this,file_descriptor_impl *p)

{
  element_type *peVar1;
  sp_counted_base *psVar2;
  shared_ptr<boost::iostreams::detail::file_descriptor_impl> local_20;
  
  if ((p != (file_descriptor_impl *)0x0) && (this->px == p)) {
    __assert_fail("p == 0 || p != px",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/boost/smart_ptr/shared_ptr.hpp"
                  ,0x298,
                  "void boost::shared_ptr<boost::iostreams::detail::file_descriptor_impl>::reset(Y *) [T = boost::iostreams::detail::file_descriptor_impl, Y = boost::iostreams::detail::file_descriptor_impl]"
                 );
  }
  shared_ptr<boost::iostreams::detail::file_descriptor_impl>(&local_20,p);
  peVar1 = this->px;
  this->px = local_20.px;
  psVar2 = (this->pn).pi_;
  (this->pn).pi_ = local_20.pn.pi_;
  local_20.px = peVar1;
  local_20.pn.pi_ = psVar2;
  detail::shared_count::~shared_count(&local_20.pn);
  return;
}

Assistant:

void reset( Y * p ) // Y must be complete
    {
        BOOST_ASSERT( p == 0 || p != px ); // catch self-reset errors
        this_type( p ).swap( *this );
    }